

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::calcRefCoords(RigidBody *this)

{
  double dVar1;
  RealType RVar2;
  RealType RVar3;
  bool bVar4;
  size_type sVar5;
  reference ppAVar6;
  double *pdVar7;
  long in_RDI;
  int i_3;
  int nLinearAxis;
  Vector3d evals;
  RealType r2;
  Mat3x3d IAtom;
  size_t i_2;
  Mat3x3d Itmp;
  size_t i_1;
  size_t i;
  Vector3d refCOM;
  RealType mtmp;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffc08;
  errorStruct *peVar8;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffc10;
  Vector<double,_3U> *in_stack_fffffffffffffc18;
  double dVar9;
  double in_stack_fffffffffffffc20;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffc28;
  Vector3<double> *in_stack_fffffffffffffc30;
  SquareMatrix3<double> *in_stack_fffffffffffffc38;
  SquareMatrix3<double> *in_stack_fffffffffffffc40;
  SquareMatrix3<double> *in_stack_fffffffffffffc48;
  uint local_308;
  int local_304;
  Vector<double,_3U> local_300;
  undefined1 local_2e8 [288];
  double local_1c8;
  RectMatrix<double,_3U,_3U> local_178;
  SquareMatrix3<double> *in_stack_ffffffffffffff00;
  Vector3<double> *in_stack_ffffffffffffff08;
  SquareMatrix3<double> *in_stack_ffffffffffffff10;
  ulong local_d8;
  ulong local_88;
  ulong local_50;
  double local_48;
  Vector<double,_3U> local_40 [2];
  RealType local_10;
  
  local_48 = 0.0;
  Vector<double,_3U>::Vector(local_40,&local_48);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffc10,
             (Vector<double,_3U> *)in_stack_fffffffffffffc08);
  *(undefined8 *)(in_RDI + 0x38) = 0;
  for (local_50 = 0;
      sVar5 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                        ), local_50 < sVar5; local_50 = local_50 + 1) {
    ppAVar6 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                         ,local_50);
    local_10 = StuntDouble::getMass(&(*ppAVar6)->super_StuntDouble);
    *(double *)(in_RDI + 0x38) = local_10 + *(double *)(in_RDI + 0x38);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x158),local_50);
    OpenMD::operator*(in_stack_fffffffffffffc18,(double)in_stack_fffffffffffffc10);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_fffffffffffffc10,
               (Vector<double,_3U> *)in_stack_fffffffffffffc08);
  }
  operator/(in_stack_fffffffffffffc18,(double)in_stack_fffffffffffffc10);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffc18,
             (Vector<double,_3U> *)in_stack_fffffffffffffc10);
  for (local_88 = 0;
      sVar5 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                        ), local_88 < sVar5; local_88 = local_88 + 1) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x158),local_88);
    Vector<double,_3U>::operator-=
              ((Vector<double,_3U> *)in_stack_fffffffffffffc10,
               (Vector<double,_3U> *)in_stack_fffffffffffffc08);
  }
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)in_stack_fffffffffffffc10,(double)in_stack_fffffffffffffc08);
  for (local_d8 = 0;
      sVar5 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                        ), local_d8 < sVar5; local_d8 = local_d8 + 1) {
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)in_stack_fffffffffffffc10,(double)in_stack_fffffffffffffc08)
    ;
    ppAVar6 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                         ,local_d8);
    local_10 = StuntDouble::getMass(&(*ppAVar6)->super_StuntDouble);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x158),local_d8);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x158),local_d8);
    outProduct<double>((Vector3<double> *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    OpenMD::operator*(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    RectMatrix<double,_3U,_3U>::operator-=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    RectMatrix<double,_3U,_3U>::~RectMatrix(&local_178);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x278593);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x158),local_d8);
    dVar9 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x2785b7);
    RVar2 = local_10;
    local_1c8 = dVar9;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)&stack0xfffffffffffffee0,0,0);
    RVar3 = local_10;
    dVar1 = local_1c8;
    *pdVar7 = RVar2 * dVar9 + *pdVar7;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)&stack0xfffffffffffffee0,1,1);
    RVar2 = local_10;
    dVar9 = local_1c8;
    *pdVar7 = RVar3 * dVar1 + *pdVar7;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)&stack0xfffffffffffffee0,2,2);
    *pdVar7 = RVar2 * dVar9 + *pdVar7;
    RectMatrix<double,_3U,_3U>::operator+=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),local_d8)
    ;
    bVar4 = Atom::isDirectional((Atom *)0x278738);
    if (bVar4) {
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI + 0x170),local_d8);
      SquareMatrix3<double>::transpose(in_stack_fffffffffffffc38);
      ppAVar6 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                          ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                           (in_RDI + 0x128),local_d8);
      (*((*ppAVar6)->super_StuntDouble)._vptr_StuntDouble[5])(local_2e8);
      OpenMD::operator*(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI + 0x170),local_d8);
      OpenMD::operator*(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      RectMatrix<double,_3U,_3U>::operator+=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x278824);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x278831);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27883e);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27884b);
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x278964);
  }
  Vector3<double>::Vector3((Vector3<double> *)0x27899c);
  SquareMatrix3<double>::diagonalize
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  pdVar7 = Vector<double,_3U>::operator[](&local_300,0);
  dVar9 = *pdVar7;
  pdVar7 = RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x98),0,0)
  ;
  *pdVar7 = dVar9;
  pdVar7 = Vector<double,_3U>::operator[](&local_300,1);
  dVar9 = *pdVar7;
  pdVar7 = RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x98),1,1)
  ;
  *pdVar7 = dVar9;
  pdVar7 = Vector<double,_3U>::operator[](&local_300,2);
  dVar9 = *pdVar7;
  pdVar7 = RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x98),2,2)
  ;
  *pdVar7 = dVar9;
  local_304 = 0;
  for (local_308 = 0; (int)local_308 < 3; local_308 = local_308 + 1) {
    pdVar7 = Vector<double,_3U>::operator[](&local_300,local_308);
    if (ABS(*pdVar7) < 1e-06) {
      *(undefined1 *)(in_RDI + 0x20) = 1;
      *(uint *)(in_RDI + 0x24) = local_308;
      local_304 = local_304 + 1;
    }
  }
  if (1 < local_304) {
    peVar8 = &painCave;
    snprintf(painCave.errMsg,2000,
             "RigidBody error.\n\tOpenMD found more than one axis in this rigid body with a vanishing \n\tmoment of inertia.  This can happen in one of three ways:\n\t 1) Only one atom was specified, or \n\t 2) All atoms were specified at the same location, or\n\t 3) The programmers did something stupid.\n\tIt is silly to use a rigid body to describe this situation.  Be smarter.\n"
            );
    peVar8->isFatal = 1;
    simError();
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x278bb1);
  return;
}

Assistant:

void RigidBody::calcRefCoords() {
    RealType mtmp;
    Vector3d refCOM(0.0);
    mass_ = 0.0;
    for (std::size_t i = 0; i < atoms_.size(); ++i) {
      mtmp = atoms_[i]->getMass();
      mass_ += mtmp;
      refCOM += refCoords_[i] * mtmp;
    }
    refCOM_ = refCOM / mass_;

    // Next, move the origin of the reference coordinate system to the COM:
    for (std::size_t i = 0; i < atoms_.size(); ++i) {
      refCoords_[i] -= refCOM_;
    }

    // Moment of Inertia calculation
    Mat3x3d Itmp(0.0);
    for (std::size_t i = 0; i < atoms_.size(); i++) {
      Mat3x3d IAtom(0.0);
      mtmp = atoms_[i]->getMass();
      IAtom -= outProduct(refCoords_[i], refCoords_[i]) * mtmp;
      RealType r2 = refCoords_[i].lengthSquare();
      IAtom(0, 0) += mtmp * r2;
      IAtom(1, 1) += mtmp * r2;
      IAtom(2, 2) += mtmp * r2;
      Itmp += IAtom;

      // project the inertial moment of directional atoms into this rigid body
      if (atoms_[i]->isDirectional()) {
        Itmp += refOrients_[i].transpose() * atoms_[i]->getI() * refOrients_[i];
      }
    }

    // diagonalize
    Vector3d evals;
    Mat3x3d::diagonalize(Itmp, evals, sU_);

    // zero out I and then fill the diagonals with the moments of inertia:
    inertiaTensor_(0, 0) = evals[0];
    inertiaTensor_(1, 1) = evals[1];
    inertiaTensor_(2, 2) = evals[2];

    int nLinearAxis = 0;
    for (int i = 0; i < 3; i++) {
      if (fabs(evals[i]) < OpenMD::epsilon) {
        linear_     = true;
        linearAxis_ = i;
        ++nLinearAxis;
      }
    }

    if (nLinearAxis > 1) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "RigidBody error.\n"
          "\tOpenMD found more than one axis in this rigid body with a "
          "vanishing \n"
          "\tmoment of inertia.  This can happen in one of three ways:\n"
          "\t 1) Only one atom was specified, or \n"
          "\t 2) All atoms were specified at the same location, or\n"
          "\t 3) The programmers did something stupid.\n"
          "\tIt is silly to use a rigid body to describe this situation.  Be "
          "smarter.\n");
      painCave.isFatal = 1;
      simError();
    }
  }